

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

void __thiscall
t_d_generator::print_function_signature(t_d_generator *this,ostream *out,t_function *fn)

{
  t_function *ptVar1;
  bool bVar2;
  t_type *ptVar3;
  ostream *poVar4;
  string *psVar5;
  t_struct *this_00;
  reference pptVar6;
  string local_d8;
  string local_b8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_98;
  t_field **local_90;
  byte local_81;
  const_iterator cStack_80;
  bool first;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_40;
  t_function *local_20;
  t_function *fn_local;
  ostream *out_local;
  t_d_generator *this_local;
  
  local_20 = fn;
  fn_local = (t_function *)out;
  out_local = (ostream *)this;
  ptVar3 = t_function::get_returntype(fn);
  render_type_name_abi_cxx11_(&local_40,this,ptVar3,false);
  poVar4 = std::operator<<(out,(string *)&local_40);
  poVar4 = std::operator<<(poVar4," ");
  psVar5 = t_function::get_name_abi_cxx11_(local_20);
  suffix_if_reserved((string *)&fields,psVar5);
  poVar4 = std::operator<<(poVar4,(string *)&fields);
  std::operator<<(poVar4,"(");
  std::__cxx11::string::~string((string *)&fields);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = t_function::get_arglist(local_20);
  f_iter._M_current = (t_field **)t_struct::get_members(this_00);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&stack0xffffffffffffff80);
  local_81 = 1;
  local_90 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  cStack_80 = (const_iterator)local_90;
  while( true ) {
    local_98._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffff80,&local_98);
    if (!bVar2) break;
    if ((local_81 & 1) == 0) {
      std::operator<<((ostream *)fn_local,", ");
    }
    else {
      local_81 = 0;
    }
    ptVar1 = fn_local;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff80);
    ptVar3 = t_field::get_type(*pptVar6);
    render_type_name_abi_cxx11_(&local_b8,this,ptVar3,true);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_b8);
    poVar4 = std::operator<<(poVar4," ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff80);
    psVar5 = t_field::get_name_abi_cxx11_(*pptVar6);
    suffix_if_reserved(&local_d8,psVar5);
    std::operator<<(poVar4,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xffffffffffffff80);
  }
  std::operator<<((ostream *)fn_local,")");
  return;
}

Assistant:

void print_function_signature(ostream& out, t_function* fn) {
    out << render_type_name(fn->get_returntype()) << " " << suffix_if_reserved(fn->get_name()) << "(";

    const vector<t_field*>& fields = fn->get_arglist()->get_members();
    vector<t_field*>::const_iterator f_iter;
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        out << ", ";
      }
      out << render_type_name((*f_iter)->get_type(), true) << " " << suffix_if_reserved((*f_iter)->get_name());
    }

    out << ")";
  }